

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_ex(CPUS390XState_conflict *env,uint32_t ilen,uint64_t r1,uint64_t addr)

{
  dx_helper p_Var1;
  byte bVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t a2;
  uint64_t a1;
  uint32_t d2;
  uint32_t b2;
  uint32_t d1;
  uint32_t b1;
  uint32_t l;
  dx_helper helper;
  ulong uStack_30;
  uint8_t opc;
  uint64_t insn;
  uint64_t addr_local;
  uint64_t r1_local;
  uint32_t ilen_local;
  CPUS390XState_conflict *env_local;
  
  uVar3 = cpu_lduw_code_s390x(env,addr);
  uStack_30._1_1_ = (byte)(uVar3 >> 8);
  bVar2 = uStack_30._1_1_;
  uVar5 = ((ulong)uVar3 | r1 & 0xff) << 0x30;
  iVar4 = get_ilen(uStack_30._1_1_);
  uStack_30 = uVar5;
  if (iVar4 != 2) {
    if (iVar4 == 4) {
      uVar3 = cpu_lduw_code_s390x(env,addr + 2);
      uStack_30 = (ulong)uVar3 << 0x20 | uVar5;
    }
    else {
      if (iVar4 != 6) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/mem_helper.c"
                   ,0x977,(char *)0x0);
      }
      uVar3 = cpu_ldl_code_s390x(env,addr + 2);
      uStack_30 = (ulong)uVar3 << 0x10 | uVar5;
    }
  }
  if ((bVar2 & 0xf0) == 0xd0) {
    p_Var1 = helper_ex::dx[(int)(bVar2 & 0xf)];
    if (p_Var1 != (dx_helper)0x0) {
      uVar6 = extract64(uStack_30,0x30,8);
      uVar7 = extract64(uStack_30,0x2c,4);
      uVar8 = extract64(uStack_30,0x20,0xc);
      uVar9 = extract64(uStack_30,0x1c,4);
      uVar10 = extract64(uStack_30,0x10,0xc);
      uVar7 = wrap_address(env,env->regs[uVar7 & 0xffffffff] + (uVar8 & 0xffffffff));
      uVar8 = wrap_address(env,env->regs[uVar9 & 0xffffffff] + (uVar10 & 0xffffffff));
      uVar3 = (*p_Var1)(env,(uint32_t)uVar6,uVar7,uVar8,0);
      env->cc_op = uVar3;
      (env->psw).addr = (ulong)ilen + (env->psw).addr;
      return;
    }
  }
  else if (bVar2 == 10) {
    uVar6 = extract64(uStack_30,0x30,8);
    env->int_svc_code = (uint32_t)uVar6;
    env->int_svc_ilen = ilen;
    helper_exception(env,2);
  }
  env->ex_value = uStack_30 | ilen;
  return;
}

Assistant:

void HELPER(ex)(CPUS390XState *env, uint32_t ilen, uint64_t r1, uint64_t addr)
{
    uint64_t insn = cpu_lduw_code(env, addr);
    uint8_t opc = insn >> 8;

    /* Or in the contents of R1[56:63].  */
    insn |= r1 & 0xff;

    /* Load the rest of the instruction.  */
    insn <<= 48;
    switch (get_ilen(opc)) {
    case 2:
        break;
    case 4:
        insn |= (uint64_t)cpu_lduw_code(env, addr + 2) << 32;
        break;
    case 6:
        insn |= (uint64_t)(uint32_t)cpu_ldl_code(env, addr + 2) << 16;
        break;
    default:
        g_assert_not_reached();
    }

    /* The very most common cases can be sped up by avoiding a new TB.  */
    if ((opc & 0xf0) == 0xd0) {
        typedef uint32_t (*dx_helper)(CPUS390XState *, uint32_t, uint64_t,
                                      uint64_t, uintptr_t);
        static const dx_helper dx[16] = {
            [0x0] = do_helper_trt_bkwd,
            [0x2] = do_helper_mvc,
            [0x4] = do_helper_nc,
            [0x5] = do_helper_clc,
            [0x6] = do_helper_oc,
            [0x7] = do_helper_xc,
            [0xc] = do_helper_tr,
            [0xd] = do_helper_trt_fwd,
        };
        dx_helper helper = dx[opc & 0xf];

        if (helper) {
            uint32_t l = extract64(insn, 48, 8);
            uint32_t b1 = extract64(insn, 44, 4);
            uint32_t d1 = extract64(insn, 32, 12);
            uint32_t b2 = extract64(insn, 28, 4);
            uint32_t d2 = extract64(insn, 16, 12);
            uint64_t a1 = wrap_address(env, env->regs[b1] + d1);
            uint64_t a2 = wrap_address(env, env->regs[b2] + d2);

            env->cc_op = helper(env, l, a1, a2, 0);
            env->psw.addr += ilen;
            return;
        }
    } else if (opc == 0x0a) {
        env->int_svc_code = extract64(insn, 48, 8);
        env->int_svc_ilen = ilen;
        helper_exception(env, EXCP_SVC);
        g_assert_not_reached();
    }

    /* Record the insn we want to execute as well as the ilen to use
       during the execution of the target insn.  This will also ensure
       that ex_value is non-zero, which flags that we are in a state
       that requires such execution.  */
    env->ex_value = insn | ilen;
}